

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSize __thiscall QDockAreaLayoutInfo::maximumSize(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  bool bVar2;
  Orientation OVar3;
  QSize QVar4;
  QSize QVar5;
  Representation RVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  Representation RVar11;
  QDockAreaLayoutItem *this_00;
  int local_4c;
  
  bVar1 = isEmpty(this);
  RVar6.m_i = 0xffffff;
  RVar11.m_i = 0xffffff;
  if (!bVar1) {
    lVar7 = 0;
    local_4c = 0xffffff;
    iVar8 = 0;
    if (this->tabbed != false) {
      iVar8 = 0xffffff;
    }
    bVar1 = true;
    iVar10 = 0;
    for (uVar9 = 0; uVar9 < (ulong)(this->item_list).d.size; uVar9 = uVar9 + 1) {
      this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar7);
      bVar2 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar2) {
        QVar4 = QDockAreaLayoutItem::maximumSize(this_00);
        OVar3 = this->o;
        QVar5 = QDockAreaLayoutItem::minimumSize(this_00);
        RVar11 = QVar5.ht.m_i;
        if (OVar3 == Vertical) {
          RVar11 = QVar5.wd.m_i;
        }
        if (RVar11.m_i < iVar10) {
          RVar11.m_i = iVar10;
        }
        iVar10 = RVar11.m_i;
        if (this->tabbed == true) {
          OVar3 = this->o;
          RVar11.m_i = QVar4.ht.m_i.m_i;
          if (OVar3 == Horizontal) {
            RVar11.m_i = QVar4.wd.m_i.m_i;
          }
          if (RVar11.m_i <= iVar8) {
            iVar8 = RVar11.m_i;
          }
        }
        else {
          if (!bVar1) {
            iVar8 = iVar8 + *this->sep;
          }
          OVar3 = this->o;
          RVar11.m_i = QVar4.ht.m_i.m_i;
          if (OVar3 == Horizontal) {
            RVar11.m_i = QVar4.wd.m_i.m_i;
          }
          iVar8 = iVar8 + RVar11.m_i;
        }
        QVar5 = (QSize)((ulong)QVar4 >> 0x20);
        if (OVar3 == Vertical) {
          QVar5 = QVar4;
        }
        RVar11.m_i = QVar5.wd.m_i.m_i;
        if (local_4c < QVar5.wd.m_i.m_i) {
          RVar11.m_i = local_4c;
        }
        if (0xfffffe < iVar8) {
          iVar8 = 0xffffff;
        }
        if (0xfffffe < RVar11.m_i) {
          RVar11.m_i = 0xffffff;
        }
        bVar1 = false;
        local_4c = RVar11.m_i;
      }
      lVar7 = lVar7 + 0x28;
    }
    if (iVar10 < local_4c) {
      iVar10 = local_4c;
    }
    RVar11.m_i = iVar8;
    RVar6.m_i = iVar10;
    if ((this->o != Horizontal) && (RVar11.m_i = iVar10, RVar6.m_i = iVar8, this->o != Vertical)) {
      RVar11.m_i = -1;
      RVar6.m_i = iVar10;
    }
    QVar4 = tabBarSizeHint(this);
    if ((ulong)QVar4 >> 0x20 != 0 || QVar4.wd.m_i.m_i != 0) {
      if (this->tabBarShape - 2U < 2) {
        RVar11.m_i = RVar11.m_i + QVar4.wd.m_i.m_i;
      }
      else if ((uint)this->tabBarShape < 2) {
        RVar6.m_i = RVar6.m_i + QVar4.ht.m_i.m_i;
      }
    }
  }
  QVar4.ht.m_i = RVar6.m_i;
  QVar4.wd.m_i = RVar11.m_i;
  return QVar4;
}

Assistant:

QSize QDockAreaLayoutInfo::maximumSize() const
{
    if (isEmpty())
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

    int a = 0, b = QWIDGETSIZE_MAX;
#if QT_CONFIG(tabbar)
    if (tabbed)
        a = QWIDGETSIZE_MAX;
#endif

    int min_perp = 0;

    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize max_size = item.maximumSize();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMin(a, pick(o, max_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, max_size);
        }
        b = qMin(b, perp(o, max_size));

        a = qMin(a, int(QWIDGETSIZE_MAX));
        b = qMin(b, int(QWIDGETSIZE_MAX));

        first = false;
    }

    b = qMax(b, min_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbh = tabBarSizeHint();
    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
                result.rheight() += tbh.height();
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}